

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_return_pass.h
# Opt level: O0

void __thiscall spvtools::opt::MergeReturnPass::~MergeReturnPass(MergeReturnPass *this)

{
  MergeReturnPass *this_local;
  
  ~MergeReturnPass(this);
  operator_delete(this,0x1c8);
  return;
}

Assistant:

MergeReturnPass()
      : function_(nullptr),
        return_flag_(nullptr),
        return_value_(nullptr),
        constant_true_(nullptr),
        final_return_block_(nullptr) {}